

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.h
# Opt level: O2

int __thiscall
TPZMatrix<Fad<float>_>::Put(TPZMatrix<Fad<float>_> *this,int64_t row,int64_t col,Fad<float> *value)

{
  int iVar1;
  
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])();
  return iVar1;
}

Assistant:

inline int TPZMatrix<TVar>::Put(const int64_t row,const int64_t col,const TVar & value ) {
	// bound checking
#ifdef PZDEBUG
	if ( row >= Rows() || col >= Cols() || row <0 || col < 0 ) {
		std::stringstream sout;
		sout << "TPZMatrix<TVar>::Put" << " Index out of range row = " << row << " col = " << col << " Rows() " << Rows() << " Cols() " << Cols() << std::endl;
		Error(sout.str().c_str());
	}
#endif
	
	return( PutVal( row, col, value ) );
}